

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O2

void dump_2D_fdtd(fdtd2D *fdtd,char *fileName,dumpable_data what_to_dump)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  FILE *__stream;
  ulong uVar5;
  void **ppvVar6;
  ulong uVar7;
  void *pvVar8;
  uintmax_t j;
  ulong uVar9;
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM3 [16];
  
  __stream = fopen(fileName,"w");
  if (what_to_dump - dump_ez < 6) {
    uVar5 = fdtd->sizeY;
    switch(what_to_dump) {
    case dump_ez:
      ppvVar6 = &fdtd->ez;
      break;
    case dump_hx:
      ppvVar6 = &fdtd->hx;
      break;
    case dump_hy:
      ppvVar6 = &fdtd->hy;
      break;
    case dump_hz:
      goto switchD_001032ed_caseD_5;
    case dump_permittivity:
      ppvVar6 = &fdtd->permittivity_inv;
      break;
    case dump_permeability:
      ppvVar6 = &fdtd->permeability_inv;
    }
    pvVar8 = *ppvVar6;
    lVar1 = uVar5 * 8;
    for (uVar7 = 0; uVar7 < fdtd->sizeX; uVar7 = uVar7 + 1) {
      auVar3 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,uVar7);
      for (uVar9 = 1; uVar9 < uVar5; uVar9 = uVar9 + 1) {
        auVar4 = vcvtusi2sd_avx512f(in_XMM3,uVar9);
        dVar2 = auVar4._0_8_ * fdtd->dy;
        in_ZMM1 = ZEXT864((ulong)dVar2);
        fprintf(__stream,"%e %e %e\n",auVar3._0_8_ * fdtd->dx,dVar2,
                *(undefined8 *)((long)pvVar8 + uVar9 * 8));
        uVar5 = fdtd->sizeY;
      }
      pvVar8 = (void *)((long)pvVar8 + lVar1);
    }
    fclose(__stream);
    return;
  }
switchD_001032ed_caseD_5:
  fprintf(_stderr,"Dump of \"%s\" not available for 2D fdtd\n",dumpable_data_name[what_to_dump]);
  exit(1);
}

Assistant:

void dump_2D_fdtd(const struct fdtd2D *fdtd, const char *fileName,
                  enum dumpable_data what_to_dump) {
  FILE *out = fopen(fileName, "w");
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, data, fdtd->ez);
  switch (what_to_dump) {
  case dump_ez:
    break;
  case dump_hx:
    data = fdtd->hx;
    break;
  case dump_hy:
    data = fdtd->hy;
    break;
  case dump_permeability:
    data = fdtd->permeability_inv;
    break;
  case dump_permittivity:
    data = fdtd->permittivity_inv;
    break;
  default:
    fprintf(stderr, "Dump of \"%s\" not available for 2D fdtd\n",
            dumpable_data_name[what_to_dump]);
    exit(EXIT_FAILURE);
  }
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
    for (uintmax_t j = 1; j < fdtd->sizeY; ++j) {
      fprintf(out, "%e %e %e\n", (float_type)i * fdtd->dx,
              (float_type)j * fdtd->dy, data[i][j]);
    }
  }
  fclose(out);
}